

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall AbstractModuleClient::sendSettleCommand(AbstractModuleClient *this)

{
  byte bVar1;
  MlmWrap *in_RDI;
  TrodesMsg m;
  undefined7 in_stack_ffffffffffffff80;
  TrodesMsg *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [64];
  TrodesMsg *in_stack_fffffffffffffff0;
  
  TrodesMsg::TrodesMsg(in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"s",&local_51);
  TrodesMsg::addcontents<char_const*>
            ((TrodesMsg *)this,(string *)m.msg,(char *)m.format.field_2._8_8_);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = MlmWrap::sendHardwareMessage(in_RDI,in_stack_fffffffffffffff0);
  TrodesMsg::~TrodesMsg((TrodesMsg *)CONCAT17(bVar1,in_stack_ffffffffffffff80));
  return (bool)(bVar1 & 1);
}

Assistant:

bool AbstractModuleClient::sendSettleCommand(){
    TrodesMsg m;
    m.addcontents("s", settle_CMD);
    return sendHardwareMessage(m);
}